

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::SyncPointVk::~SyncPointVk(SyncPointVk *this)

{
  SyncPointVk *local_28;
  uint local_14;
  Uint32 s;
  SyncPointVk *this_local;
  
  for (local_14 = 1; local_14 < this->m_NumSemaphores; local_14 = local_14 + 1) {
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    ~RecycledSyncObject(this->m_Semaphores + local_14);
  }
  local_28 = this + 1;
  do {
    local_28 = (SyncPointVk *)local_28[-1].m_Semaphores;
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    ~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)local_28);
  } while (local_28 != (SyncPointVk *)this->m_Semaphores);
  VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkFenceType>::
  ~RecycledSyncObject(&this->m_Fence);
  std::enable_shared_from_this<Diligent::SyncPointVk>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<Diligent::SyncPointVk>);
  return;
}

Assistant:

SyncPointVk::~SyncPointVk()
{
    // Call destructors for semaphores
    for (Uint32 s = _countof(m_Semaphores); s < m_NumSemaphores; ++s)
        m_Semaphores[s].~RecycledSyncObject();
}